

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O2

double __thiscall
Problem_CGBG_FF::ComputeLocalProbability
          (Problem_CGBG_FF *this,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  const_reference pvVar1;
  const_reference pvVar2;
  _Base_ptr p_Var3;
  uint uVar4;
  double dVar5;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> house_scope;
  double local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar4 = 0;
      (ulong)uVar4 <
      (ulong)((long)(tupleOfAgents->super_SDT).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(tupleOfAgents->super_SDT).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&tupleOfAgents->super_SDT,(ulong)uVar4);
    pvVar2 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(&this->_m_houseIndices_obs,(ulong)*pvVar1);
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&local_60,
               (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
  }
  local_68 = 1.0;
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    dVar5 = ComputeHouseProbability(this,p_Var3[1]._M_color,tupleOfAgents,types);
    local_68 = local_68 * dVar5;
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return local_68;
}

Assistant:

double Problem_CGBG_FF::ComputeLocalProbability( 
        const Scope& tupleOfAgents,
        const vector<Index>& types
        ) const
{

    /* Let
        - si denote the fire level of house i
        - hi denote the observation of house i (by some agent left unspecified here)

       Given that 
        1) the fire levels at different houses are independent P(s)=P(s1)*...*P(sN),
        2) the observation made of different houses are independent: P(h1h2|s)=P(h1|s1)P(h2|s2)
        the following should work.
      
       assume 2 agents that observe 2 houses each:
        -agent 1 gets observations of houses 1 and 2: t1=<h1,h2>
        -agent 2 gets observations of houses 2 and 3: t2=<h2,h3>
       
       Then P(t1,t2)
        = \sum_s P(t1|s)P(t2|s)P(s)
        = \sum_{s1} \sum_{s2} \sum_{s3} [ P(h1|s1)P(h2|s2) ] * [ P(h2|s2)P(h3|s3) ] * P(s1)P(s2)P(s3)
        = [sum_{s1} P(h1|s1) P(s1)] * [sum_{s2} P(h2|s2)P(h2|s2)P(s2)] * [sum_{s3} P(h3|s3) P(s3)]

       So we can compute the probability of a joint type, as the product of a term for each house
       in the `observation scope':
          ComputeHouseProbability(h1, observations_for_h1) * 
          ComputeHouseProbability(h2, observations_for_h2) * 
          ComputeHouseProbability(h3, observations_for_h3)  
    */

    //first we detemine the houses that are 'in scope'
    std::set<Index> house_scope;
    for(Index i=0; i < tupleOfAgents.size(); i++)
    {
        Index agI = tupleOfAgents.at(i);
        const vector<Index> & obsHouseIndices = _m_houseIndices_obs.at(agI);
        house_scope.insert(obsHouseIndices.begin(), obsHouseIndices.end());
#if DEBUGPROBS
        cout << "Agent " << agI << " observes houses " << PrintTools::SoftPrintVector(obsHouseIndices) << endl;
#endif
    }
#if DEBUGPROBS
    cout << "'Combined houses scope' = " << PrintTools::SoftPrintSet(house_scope) << endl;
    cout << "Computing probability term (e.g. [sum_{s2} P(h2|s2)P(h2|s2)P(s2)] ) for each house..."<<endl;
#endif
    //for each house:
    std::set<Index>::iterator it =  house_scope.begin();
    std::set<Index>::iterator last =  house_scope.end();
    double p = 1.0;
    while (it != last)
    {
        Index hI = *it;
#if DEBUGPROBS
        cout << "house " << hI << "..."<<endl;
#endif
        double phI = ComputeHouseProbability(hI, tupleOfAgents, types);
#if DEBUGPROBS
        cout << "...house " << hI << " probability term, P(h_obs,h_obs) = " << phI << endl;
#endif
        p *= phI;
        it++;
    }
    return p;
}